

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

void __thiscall rcg::Stream::stopStreaming(Stream *this)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  GC_ERROR GVar4;
  undefined4 extraout_var;
  IBase *pIVar5;
  ICommand *pIVar6;
  undefined4 extraout_var_00;
  long *plVar7;
  size_t i;
  ulong uVar8;
  shared_ptr<GenApi_3_4::CNodeMapRef> nmap;
  BUFFER_HANDLE p;
  CCommandPtr stop;
  
  std::recursive_mutex::lock(&this->mtx);
  if (this->bn != 0) {
    Buffer::setHandle(&this->buffer,(void *)0x0);
    Device::getRemoteNodeMap
              ((Device *)&nmap,
               (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    peVar1 = nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    GenICam_3_4::gcstring::gcstring((gcstring *)&p,"AcquisitionStop");
    iVar3 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
              super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&p);
    plVar7 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar7 == (long *)0x0) {
      pIVar5 = (IBase *)0x0;
    }
    else {
      pIVar5 = (IBase *)((long)plVar7 + *(long *)(*plVar7 + -0x28));
    }
    GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::CPointer(&stop,pIVar5);
    GenICam_3_4::gcstring::~gcstring((gcstring *)&p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pIVar6 = GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->(&stop);
    (**(code **)(*(long *)pIVar6 + 0x38))(pIVar6);
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->DSStopAcquisition)(this->stream,0);
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->GCUnregisterEvent)(this->stream,1);
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->DSFlushQueue)(this->stream,4);
    for (uVar8 = 0; uVar8 < this->bn; uVar8 = uVar8 + 1) {
      p = (BUFFER_HANDLE)0x0;
      GVar4 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DSGetBufferID)(this->stream,0,&p);
      if (GVar4 == 0) {
        (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->DSRevokeBuffer)(this->stream,p,(void **)0x0,(void **)0x0);
      }
    }
    this->event = (void *)0x0;
    this->bn = 0;
    Device::getRemoteNodeMap
              ((Device *)&nmap,
               (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    GenICam_3_4::gcstring::gcstring((gcstring *)&p,"TLParamsLocked");
    iVar3 = (*((nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
              super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])
                      (nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&p);
    if (CONCAT44(extraout_var_00,iVar3) == 0) {
      plVar7 = (long *)0x0;
    }
    else {
      plVar7 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar3),&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    }
    GenICam_3_4::gcstring::~gcstring((gcstring *)&p);
    if (plVar7 == (long *)0x0) {
      pIVar5 = (IBase *)0x0;
    }
    else {
      pIVar5 = (IBase *)(*(long *)(*plVar7 + -0x28) + (long)plVar7);
    }
    bVar2 = GenApi_3_4::IsWritable(pIVar5);
    if (bVar2) {
      (**(code **)(*plVar7 + 0x38))(plVar7,0,1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nmap.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void Stream::stopStreaming()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (bn > 0)
  {
    buffer.setHandle(0);

    // do not throw exceptions as this method is also called in destructor

    GenApi::CCommandPtr stop=parent->getRemoteNodeMap()->_GetNode("AcquisitionStop");
    stop->Execute();

    gentl->DSStopAcquisition(stream, GenTL::ACQ_STOP_FLAGS_DEFAULT);
    gentl->GCUnregisterEvent(stream, GenTL::EVENT_NEW_BUFFER);
    gentl->DSFlushQueue(stream, GenTL::ACQ_QUEUE_ALL_DISCARD);

    // free all buffers

    for (size_t i=0; i<bn; i++)
    {
      GenTL::BUFFER_HANDLE p=0;
      if (gentl->DSGetBufferID(stream, 0, &p) == GenTL::GC_ERR_SUCCESS)
      {
        gentl->DSRevokeBuffer(stream, p, 0, 0);
      }
    }

    event=0;
    bn=0;

    // unlock parameters

    std::shared_ptr<GenApi::CNodeMapRef> nmap=parent->getRemoteNodeMap();
    GenApi::IInteger *pi=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

    if (GenApi::IsWritable(pi))
    {
      pi->SetValue(0);
    }
  }
}